

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void * alsaMidiHandler(void *ptr)

{
  undefined8 *puVar1;
  byte bVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined8 *puVar5;
  code *pcVar6;
  long lVar7;
  byte *pbVar8;
  snd_seq_event_t *psVar9;
  pointer puVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  pollfd *__fds;
  ulong uVar18;
  undefined8 uStack_80;
  pollfd pStack_78;
  byte *local_70;
  snd_seq_event_t *ev;
  MidiMessage message;
  undefined1 local_39;
  void *pvStack_38;
  bool dummy;
  
  __fds = &pStack_78;
  puVar5 = *(undefined8 **)((long)ptr + 0x40);
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ev = (snd_seq_event_t *)0x0;
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)(puVar5 + 4) = 0x20;
  puVar1 = puVar5 + 3;
  uStack_80 = 0x109895;
  iVar12 = snd_midi_event_new(0,puVar1);
  if (iVar12 < 0) {
    *(undefined1 *)((long)ptr + 0x39) = 0;
    uStack_80 = 0x109c78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n",0x45);
    goto LAB_00109cd4;
  }
  uStack_80 = 0x1098a6;
  pvVar14 = malloc((ulong)*(uint *)(puVar5 + 4));
  if (pvVar14 == (void *)0x0) {
    *(undefined1 *)((long)ptr + 0x39) = 0;
    uStack_80 = 0x109c87;
    snd_midi_event_free(*puVar1);
    *puVar1 = 0;
    uStack_80 = 0x109ca6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n",0x41);
    __fds = &pStack_78;
    goto LAB_00109cd4;
  }
  uStack_80 = 0x1098bb;
  pvStack_38 = pvVar14;
  snd_midi_event_init(*puVar1);
  uStack_80 = 0x1098c8;
  snd_midi_event_no_status(*puVar1,1);
  uStack_80 = 0x1098d5;
  iVar12 = snd_seq_poll_descriptors_count(*puVar5,1);
  uVar16 = (long)iVar12 * 8 + 0x17U & 0xfffffffffffffff0;
  lVar7 = -uVar16;
  __fds = (pollfd *)((long)&pStack_78 + lVar7);
  uVar17 = *puVar5;
  *(undefined8 *)((long)&uStack_80 + lVar7) = 0x10990a;
  snd_seq_poll_descriptors(uVar17,(long)&local_70 - uVar16,iVar12,1);
  __fds->fd = *(int *)((long)puVar5 + 0x4c);
  *(undefined2 *)((long)&pStack_78 + lVar7 + 4) = 1;
  if (*(char *)((long)ptr + 0x39) == '\x01') {
    message.timeStamp = 0.0;
    do {
      uVar17 = *puVar5;
      *(undefined8 *)((long)&uStack_80 + lVar7) = 0x10993c;
      iVar13 = snd_seq_event_input_pending(uVar17,1);
      if (iVar13 == 0) {
        *(undefined8 *)((long)&uStack_80 + lVar7) = 0x10997b;
        iVar13 = poll(__fds,(long)iVar12 + 1,-1);
        if ((-1 < iVar13) && ((*(byte *)((long)&pStack_78 + lVar7 + 6) & 1) != 0)) {
          iVar13 = __fds->fd;
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109998;
          read(iVar13,&local_39,1);
        }
      }
      else {
        uVar17 = *puVar5;
        *(undefined8 *)((long)&uStack_80 + lVar7) = 0x10994c;
        iVar13 = snd_seq_event_input(uVar17,&local_70);
        pvVar14 = pvStack_38;
        if (iVar13 == -0x1c) {
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109969;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n",0x3a);
        }
        else if (iVar13 < 1) {
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099b6;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n",0x38);
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099c2;
          perror("System reports");
        }
        else {
          if ((((ulong)message.timeStamp & 1) == 0) &&
             ((snd_seq_event_t *)
              message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != ev)) {
            message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = &ev->type;
          }
          bVar2 = *local_70;
          if (bVar2 < 0x2a) {
            if ((((bVar2 != 0x16) && (bVar2 != 0x24)) && (bVar2 != 0x25)) ||
               ((*(byte *)((long)ptr + 0x38) & 2) == 0)) goto LAB_00109a0c;
          }
          else if (1 < bVar2 - 0x42) {
            if (bVar2 == 0x2a) {
              if ((*(byte *)((long)ptr + 0x38) & 4) != 0) goto LAB_00109bb5;
            }
            else if (bVar2 == 0x82) {
              if ((*(byte *)((long)ptr + 0x38) & 1) != 0) goto LAB_00109bb5;
              if (*(uint *)(puVar5 + 4) < *(uint *)(local_70 + 0x10)) {
                *(uint *)(puVar5 + 4) = *(uint *)(local_70 + 0x10);
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a82;
                free(pvVar14);
                uVar4 = *(uint *)(puVar5 + 4);
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a8b;
                pvVar14 = malloc((ulong)uVar4);
                if (pvVar14 == (void *)0x0) {
                  *(undefined1 *)((long)ptr + 0x39) = 0;
                  *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109c4e;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n",0x3d
                            );
                  pvStack_38 = (void *)0x0;
                  goto LAB_00109bb5;
                }
              }
            }
LAB_00109a0c:
            pvStack_38 = pvVar14;
            pvVar14 = pvStack_38;
            pbVar8 = local_70;
            uVar17 = puVar5[3];
            uVar3 = *(undefined4 *)(puVar5 + 4);
            *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a1d;
            lVar15 = snd_midi_event_decode(uVar17,pvVar14,uVar3,pbVar8);
            pvVar14 = pvStack_38;
            puVar10 = message.bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < lVar15) {
              if (((ulong)message.timeStamp & 1) == 0) {
                lVar15 = lVar15 + (long)pvStack_38;
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ab4;
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_assign_aux<unsigned_char*>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ev,pvVar14,lVar15
                          );
                uVar17 = extraout_RDX_00;
              }
              else {
                lVar15 = lVar15 + (long)pvStack_38;
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a43;
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_range_insert<unsigned_char*>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ev,puVar10,
                           pvVar14,lVar15);
                uVar17 = extraout_RDX;
              }
              if ((*local_70 != 0x82) ||
                 (message.timeStamp = (double)CONCAT71((int7)((ulong)uVar17 >> 8),1),
                 message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start[-1] == 0xf7)) {
                message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                uVar16 = (ulong)*(uint *)(puVar5 + 8);
                uVar18 = (ulong)*(uint *)((long)puVar5 + 0x44);
                uVar4 = *(uint *)(local_70 + 8);
                if (uVar4 < *(uint *)((long)puVar5 + 0x44)) {
                  iVar13 = (int)((long)(uVar18 - (long)(int)uVar4) / 1000000000);
                  uVar18 = uVar18 - (long)(iVar13 * 1000000000 + 1000000000);
                  uVar16 = uVar16 + (long)iVar13 + 1;
                }
                if (1000000000 < (long)(uVar4 - uVar18)) {
                  lVar15 = (long)((long)(int)uVar4 - uVar18) / 1000000000;
                  uVar16 = uVar16 - lVar15;
                  uVar18 = uVar18 + (lVar15 * 0x3b9aca0000000000 >> 0x20);
                }
                iVar13 = *(int *)(local_70 + 4);
                puVar5[8] = *(undefined8 *)(local_70 + 4);
                if (*(char *)((long)ptr + 0x3a) == '\x01') {
                  *(undefined1 *)((long)ptr + 0x3a) = 0;
                }
                else {
                  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((double)(long)((long)(int)uVar4 - uVar18) * 1e-09 +
                                (double)(long)((long)iVar13 - uVar16));
                }
                message.timeStamp = 0.0;
              }
            }
          }
LAB_00109bb5:
          pbVar8 = local_70;
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109bbe;
          snd_seq_free_event(pbVar8);
          puVar10 = message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (((snd_seq_event_t *)
               message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != ev) &&
             (((ulong)message.timeStamp & 1) == 0)) {
            if (*(char *)((long)ptr + 0x48) == '\x01') {
              uVar17 = *(undefined8 *)((long)ptr + 0x58);
              pcVar6 = *(code **)((long)ptr + 0x50);
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109bee;
              (*pcVar6)(puVar10,&ev,uVar17);
            }
            else {
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109bff;
              bVar11 = MidiInApi::MidiQueue::push((MidiQueue *)ptr,(MidiMessage *)&ev);
              if (!bVar11) {
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109c1f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"\nMidiInAlsa: message queue limit reached!!\n\n",
                           0x2c);
              }
            }
          }
        }
      }
    } while (*(char *)((long)ptr + 0x39) != '\0');
    if (pvStack_38 != (void *)0x0) goto LAB_00109cb7;
  }
  else {
LAB_00109cb7:
    pvVar14 = pvStack_38;
    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109cbc;
    free(pvVar14);
  }
  uVar17 = *puVar1;
  *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109cc4;
  snd_midi_event_free(uVar17);
  puVar5[3] = 0;
  puVar5[6] = puVar5[7];
LAB_00109cd4:
  psVar9 = ev;
  if (ev != (snd_seq_event_t *)0x0) {
    uVar16 = (long)message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ev;
    __fds[-1].fd = 0x109ce9;
    __fds[-1].events = 0;
    __fds[-1].revents = 0;
    operator_delete(psVar9,uVar16);
  }
  return (void *)0x0;
}

Assistant:

static void *alsaMidiHandler( void *ptr )
{
  MidiInApi::RtMidiInData *data = static_cast<MidiInApi::RtMidiInData *> (ptr);
  AlsaMidiData *apiData = static_cast<AlsaMidiData *> (data->apiData);

  long nBytes;
  double time;
  bool continueSysex = false;
  bool doDecode = false;
  MidiInApi::MidiMessage message;
  int poll_fd_count;
  struct pollfd *poll_fds;

  snd_seq_event_t *ev;
  int result;
  apiData->bufferSize = 32;
  result = snd_midi_event_new( 0, &apiData->coder );
  if ( result < 0 ) {
    data->doInput = false;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n";
    return 0;
  }
  unsigned char *buffer = (unsigned char *) malloc( apiData->bufferSize );
  if ( buffer == NULL ) {
    data->doInput = false;
    snd_midi_event_free( apiData->coder );
    apiData->coder = 0;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n";
    return 0;
  }
  snd_midi_event_init( apiData->coder );
  snd_midi_event_no_status( apiData->coder, 1 ); // suppress running status messages

  poll_fd_count = snd_seq_poll_descriptors_count( apiData->seq, POLLIN ) + 1;
  poll_fds = (struct pollfd*)alloca( poll_fd_count * sizeof( struct pollfd ));
  snd_seq_poll_descriptors( apiData->seq, poll_fds + 1, poll_fd_count - 1, POLLIN );
  poll_fds[0].fd = apiData->trigger_fds[0];
  poll_fds[0].events = POLLIN;

  while ( data->doInput ) {

    if ( snd_seq_event_input_pending( apiData->seq, 1 ) == 0 ) {
      // No data pending
      if ( poll( poll_fds, poll_fd_count, -1) >= 0 ) {
        if ( poll_fds[0].revents & POLLIN ) {
          bool dummy;
          int res = read( poll_fds[0].fd, &dummy, sizeof(dummy) );
          (void) res;
        }
      }
      continue;
    }

    // If here, there should be data.
    result = snd_seq_event_input( apiData->seq, &ev );
    if ( result == -ENOSPC ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n";
      continue;
    }
    else if ( result <= 0 ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n";
      perror("System reports");
      continue;
    }

    // This is a bit weird, but we now have to decode an ALSA MIDI
    // event (back) into MIDI bytes.  We'll ignore non-MIDI types.
    if ( !continueSysex ) message.bytes.clear();

    doDecode = false;
    switch ( ev->type ) {

    case SND_SEQ_EVENT_PORT_SUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cout << "MidiInAlsa::alsaMidiHandler: port connection made!\n";
#endif
      break;

    case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cerr << "MidiInAlsa::alsaMidiHandler: port connection has closed!\n";
      std::cout << "sender = " << (int) ev->data.connect.sender.client << ":"
                << (int) ev->data.connect.sender.port
                << ", dest = " << (int) ev->data.connect.dest.client << ":"
                << (int) ev->data.connect.dest.port
                << std::endl;
#endif
      break;

    case SND_SEQ_EVENT_QFRAME: // MIDI time code
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_TICK: // 0xF9 ... MIDI timing tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_CLOCK: // 0xF8 ... MIDI timing (clock) tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SENSING: // Active sensing
      if ( !( data->ignoreFlags & 0x04 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SYSEX:
      if ( (data->ignoreFlags & 0x01) ) break;
      if ( ev->data.ext.len > apiData->bufferSize ) {
        apiData->bufferSize = ev->data.ext.len;
        free( buffer );
        buffer = (unsigned char *) malloc( apiData->bufferSize );
        if ( buffer == NULL ) {
          data->doInput = false;
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n";
          break;
        }
      }
      doDecode = true;
      break;

    default:
      doDecode = true;
    }

    if ( doDecode ) {

      nBytes = snd_midi_event_decode( apiData->coder, buffer, apiData->bufferSize, ev );
      if ( nBytes > 0 ) {
        // The ALSA sequencer has a maximum buffer size for MIDI sysex
        // events of 256 bytes.  If a device sends sysex messages larger
        // than this, they are segmented into 256 byte chunks.  So,
        // we'll watch for this and concatenate sysex chunks into a
        // single sysex message if necessary.
        if ( !continueSysex )
          message.bytes.assign( buffer, &buffer[nBytes] );
        else
          message.bytes.insert( message.bytes.end(), buffer, &buffer[nBytes] );

        continueSysex = ( ( ev->type == SND_SEQ_EVENT_SYSEX ) && ( message.bytes.back() != 0xF7 ) );
        if ( !continueSysex ) {

          // Calculate the time stamp:
          message.timeStamp = 0.0;

          // Method 1: Use the system time.
          //(void)gettimeofday(&tv, (struct timezone *)NULL);
          //time = (tv.tv_sec * 1000000) + tv.tv_usec;

          // Method 2: Use the ALSA sequencer event time data.
          // (thanks to Pedro Lopez-Cabanillas!).

          // Using method from:
          // https://www.gnu.org/software/libc/manual/html_node/Elapsed-Time.html

          // Perform the carry for the later subtraction by updating y.
          // Temp var y is timespec because computation requires signed types,
          // while snd_seq_real_time_t has unsigned types.
          snd_seq_real_time_t &x( ev->time.time );
          struct timespec y;
          y.tv_nsec = apiData->lastTime.tv_nsec;
          y.tv_sec = apiData->lastTime.tv_sec;
          if ( x.tv_nsec < y.tv_nsec ) {
              int nsec = (y.tv_nsec - (int)x.tv_nsec) / 1000000000 + 1;
              y.tv_nsec -= 1000000000 * nsec;
              y.tv_sec += nsec;
          }
          if ( x.tv_nsec - y.tv_nsec > 1000000000 ) {
              int nsec = ((int)x.tv_nsec - y.tv_nsec) / 1000000000;
              y.tv_nsec += 1000000000 * nsec;
              y.tv_sec -= nsec;
          }

          // Compute the time difference.
          time = (int)x.tv_sec - y.tv_sec + ((int)x.tv_nsec - y.tv_nsec)*1e-9;

          apiData->lastTime = ev->time.time;

          if ( data->firstMessage == true )
            data->firstMessage = false;
          else
            message.timeStamp = time;
        }
        else {
#if defined(__RTMIDI_DEBUG__)
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: event parsing error or not a MIDI event!\n\n";
#endif
        }
      }
    }

    snd_seq_free_event( ev );
    if ( message.bytes.size() == 0 || continueSysex ) continue;

    if ( data->usingCallback ) {
      RtMidiIn::RtMidiCallback callback = (RtMidiIn::RtMidiCallback) data->userCallback;
      callback( message.timeStamp, &message.bytes, data->userData );
    }
    else {
      // As long as we haven't reached our queue size limit, push the message.
      if ( !data->queue.push( message ) )
        std::cerr << "\nMidiInAlsa: message queue limit reached!!\n\n";
    }
  }

  if ( buffer ) free( buffer );
  snd_midi_event_free( apiData->coder );
  apiData->coder = 0;
  apiData->thread = apiData->dummy_thread_id;
  return 0;
}